

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O3

vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> * __thiscall
fasttext::Meter::precisionRecallCurve
          (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           *__return_storage_ptr__,Meter *this,int32_t labelId)

{
  pointer ppVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t uVar4;
  bool bVar5;
  const_iterator cVar6;
  undefined8 uVar7;
  difference_type __d;
  ulong uVar8;
  pointer ppVar9;
  ulong uVar10;
  pointer ppVar11;
  uint64_t uVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double recall;
  double precision;
  double local_a8;
  int32_t local_9c;
  pair<double,_double> local_98;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_80;
  double local_68;
  double dStack_60;
  uint64_t local_50;
  uint64_t local_48;
  undefined8 uStack_40;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_9c = labelId;
  getPositiveCounts(&local_80,this,labelId);
  if (local_80.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_80.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (labelId != -1) {
      cVar6 = std::
              _Hashtable<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->labelMetrics_)._M_h,&local_9c);
      if (cVar6.super__Node_iterator_base<std::pair<const_int,_fasttext::Meter::Metrics>,_false>.
          _M_cur == (__node_type *)0x0) {
        uVar7 = std::__throw_out_of_range("_Map_base::at");
        if (local_80.
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_80.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_80.
                                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_80.
                                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        ppVar1 = (__return_storage_ptr__->
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (ppVar1 != (pointer)0x0) {
          operator_delete(ppVar1,(long)(__return_storage_ptr__->
                                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                       )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)ppVar1);
        }
        _Unwind_Resume(uVar7);
      }
      this = (Meter *)((long)cVar6.
                             super__Node_iterator_base<std::pair<const_int,_fasttext::Meter::Metrics>,_false>
                             ._M_cur + 0x10);
    }
    local_50 = (this->metrics_).gold;
    uVar10 = (long)local_80.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_80.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4;
    ppVar11 = local_80.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar12 = local_50;
    if (0 < (long)uVar10) {
      uStack_40 = 0;
      auVar14._8_4_ = (int)(local_50 >> 0x20);
      auVar14._0_8_ = local_50;
      auVar14._12_4_ = 0x45300000;
      dStack_60 = auVar14._8_8_ - 1.9342813113834067e+25;
      local_68 = dStack_60 + ((double)CONCAT44(0x43300000,(int)local_50) - 4503599627370496.0);
      local_48 = local_50;
      do {
        uVar8 = uVar10 >> 1;
        uVar2 = ppVar11[uVar8].first;
        uVar3 = ppVar11[uVar8].second;
        local_98.first =
             ((double)(uVar2 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
             (double)(uVar2 & 0xffffffff | 0x4330000000000000);
        local_98.second =
             ((double)(uVar3 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
             (double)(uVar3 & 0xffffffff | 0x4330000000000000);
        local_a8 = local_68;
        bVar5 = utils::compareFirstLess(&local_98,&local_a8);
        uVar10 = uVar10 + ~uVar8;
        ppVar9 = ppVar11 + uVar8 + 1;
        if (!bVar5) {
          uVar10 = uVar8;
          ppVar9 = ppVar11;
        }
        ppVar11 = ppVar9;
        uVar12 = local_48;
      } while (0 < (long)uVar10);
    }
    uVar4 = local_50;
    if (local_80.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        ppVar11 + (ppVar11 !=
                  local_80.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)) {
      auVar15._8_4_ = (int)(uVar12 >> 0x20);
      auVar15._0_8_ = uVar12;
      auVar15._12_4_ = 0x45300000;
      dStack_60 = auVar15._8_8_ - 1.9342813113834067e+25;
      local_68 = dStack_60 + ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0);
      ppVar9 = local_80.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_98.first = 0.0;
        dVar13 = ((double)(ppVar9->first >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                 (double)(ppVar9->first & 0xffffffff | 0x4330000000000000);
        dVar16 = ((double)(ppVar9->second >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                 (double)(ppVar9->second & 0xffffffff | 0x4330000000000000) + dVar13;
        if ((dVar16 != 0.0) || (NAN(dVar16))) {
          local_98.first = dVar13 / dVar16;
        }
        local_a8 = NAN;
        if (uVar4 != 0) {
          local_a8 = dVar13 / local_68;
        }
        std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
        emplace_back<double&,double&>
                  ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                   __return_storage_ptr__,&local_98.first,&local_a8);
        ppVar9 = ppVar9 + 1;
      } while (ppVar9 != ppVar11 + (ppVar11 !=
                                   local_80.
                                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish));
    }
    local_98.first = 1.0;
    local_a8 = 0.0;
    std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
    emplace_back<double,double>
              ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
               __return_storage_ptr__,&local_98.first,&local_a8);
  }
  if (local_80.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<double, double>> Meter::precisionRecallCurve(
    int32_t labelId) const {
  std::vector<std::pair<double, double>> precisionRecallCurve;
  const auto& positiveCounts = getPositiveCounts(labelId);
  if (positiveCounts.empty()) {
    return precisionRecallCurve;
  }

  uint64_t golds =
      (labelId == kAllLabels) ? metrics_.gold : labelMetrics_.at(labelId).gold;

  auto fullRecall = std::lower_bound(
      positiveCounts.begin(),
      positiveCounts.end(),
      golds,
      utils::compareFirstLess);

  if (fullRecall != positiveCounts.end()) {
    fullRecall = std::next(fullRecall);
  }

  for (auto it = positiveCounts.begin(); it != fullRecall; it++) {
    double precision = 0.0;
    double truePositives = it->first;
    double falsePositives = it->second;
    if (truePositives + falsePositives != 0.0) {
      precision = truePositives / (truePositives + falsePositives);
    }
    double recall = golds != 0 ? (truePositives / double(golds))
                               : std::numeric_limits<double>::quiet_NaN();
    precisionRecallCurve.emplace_back(precision, recall);
  }
  precisionRecallCurve.emplace_back(1.0, 0.0);

  return precisionRecallCurve;
}